

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

string * tinygltf::FindFile(string *__return_storage_ptr__,
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *paths,string *filepath,FsCallbacks *fs)

{
  code *pcVar1;
  ulong uVar2;
  byte bVar3;
  size_type sVar4;
  const_reference path0;
  bool bVar5;
  string local_58;
  byte local_31;
  ulong local_30;
  size_t i;
  FsCallbacks *fs_local;
  string *filepath_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  string *absPath;
  
  i = (size_t)fs;
  fs_local = (FsCallbacks *)filepath;
  filepath_local = (string *)paths;
  paths_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__return_storage_ptr__;
  if (((fs == (FsCallbacks *)0x0) || (fs->ExpandFilePath == (ExpandFilePathFunction)0x0)) ||
     (fs->FileExists == (FileExistsFunction)0x0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    for (local_30 = 0; uVar2 = local_30,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)filepath_local), uVar2 < sVar4; local_30 = local_30 + 1) {
      local_31 = 0;
      pcVar1 = *(code **)(i + 8);
      path0 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)filepath_local,local_30);
      JoinPath(&local_58,path0,(string *)fs_local);
      (*pcVar1)(__return_storage_ptr__,&local_58,*(undefined8 *)(i + 0x20));
      std::__cxx11::string::~string((string *)&local_58);
      bVar3 = (**(code **)i)(__return_storage_ptr__,*(undefined8 *)(i + 0x20));
      bVar5 = (bVar3 & 1) != 0;
      if (bVar5) {
        local_31 = 1;
      }
      if ((local_31 & 1) == 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      if (bVar5) {
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FindFile(const std::vector<std::string> &paths,
                            const std::string &filepath, FsCallbacks *fs) {
  if (fs == nullptr || fs->ExpandFilePath == nullptr ||
      fs->FileExists == nullptr) {
    // Error, fs callback[s] missing
    return std::string();
  }

  for (size_t i = 0; i < paths.size(); i++) {
    std::string absPath =
        fs->ExpandFilePath(JoinPath(paths[i], filepath), fs->user_data);
    if (fs->FileExists(absPath, fs->user_data)) {
      return absPath;
    }
  }

  return std::string();
}